

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O3

int cfg_tobin_acl(void *reference,size_t bin_size,const_strarray *value)

{
  int iVar1;
  
  if (bin_size == 0x28) {
    netaddr_acl_remove((netaddr_acl *)reference);
    iVar1 = netaddr_acl_from_strarray((netaddr_acl *)reference,value);
    return iVar1;
  }
  return -1;
}

Assistant:

int
cfg_tobin_acl(void *reference, size_t bin_size, const struct const_strarray *value) {
  struct netaddr_acl *ptr;

  if (bin_size != sizeof(*ptr)) {
    return -1;
  }

  ptr = (struct netaddr_acl *)reference;
  netaddr_acl_remove(ptr);

  return netaddr_acl_from_strarray(ptr, value);
}